

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QSslCipher *cipher)

{
  long lVar1;
  _Head_base<0UL,_QSslCipherPrivate_*,_false> _Var2;
  long *plVar3;
  QDebug *pQVar4;
  QSslCipher *in_RDX;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)cipher);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined2 *)(*plVar3 + 0x30) = 0x100;
  pQVar4 = QDebug::operator<<((QDebug *)cipher,"QSslCipher(name=");
  QSslCipher::name((QString *)&local_58,in_RDX);
  pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_58);
  pQVar4 = QDebug::operator<<(pQVar4,", bits=");
  pQVar4 = QDebug::operator<<(pQVar4,((in_RDX->d)._M_t.
                                      super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>
                                      .super__Head_base<0UL,_QSslCipherPrivate_*,_false>.
                                     _M_head_impl)->bits);
  pQVar4 = QDebug::operator<<(pQVar4,", proto=");
  QSslCipher::protocolString((QString *)&local_70,in_RDX);
  pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_70);
  QDebug::operator<<(pQVar4,')');
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  _Var2._M_head_impl =
       (cipher->d)._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  (cipher->d)._M_t.super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>
  ._M_t.super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = (QSslCipherPrivate *)0x0;
  *(QSslCipherPrivate **)debug.stream = _Var2._M_head_impl;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QSslCipher &cipher)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace().noquote();
    debug << "QSslCipher(name=" << cipher.name()
          << ", bits=" << cipher.usedBits()
          << ", proto=" << cipher.protocolString()
          << ')';
    return debug;
}